

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

QStringList * __thiscall
ProStringList::toQStringList(QStringList *__return_storage_ptr__,ProStringList *this)

{
  long lVar1;
  ProString *e;
  ProString *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QString>::reserve(__return_storage_ptr__,(this->super_QList<ProString>).d.size);
  this_00 = (this->super_QList<ProString>).d.ptr;
  for (lVar1 = (this->super_QList<ProString>).d.size * 0x30; lVar1 != 0; lVar1 = lVar1 + -0x30) {
    ProString::toQString((QString *)&local_40,this_00);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    this_00 = this_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList ProStringList::toQStringList() const
{
    QStringList ret;
    ret.reserve(size());
    for (const auto &e : *this)
        ret.append(e.toQString());
    return ret;
}